

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

void __thiscall vm_rcdesc::init_ret(vm_rcdesc *this,char *name)

{
  uchar *puVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  in_RDI[2] = in_RSI;
  vm_val_t::set_nil((vm_val_t *)(in_RDI + 3));
  vm_val_t::set_nil((vm_val_t *)(in_RDI + 5));
  *(undefined2 *)(in_RDI + 7) = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  *in_RDI = 0;
  puVar1 = CVmRun::get_last_pc();
  in_RDI[8] = puVar1;
  return;
}

Assistant:

void vm_rcdesc::init_ret(VMG_ const char *name)
{
    this->name = name;
    bifptr.set_nil();
    self.set_nil();
    method_idx = 0;
    argc = 0;
    argp = 0;
    caller_addr = G_interpreter->get_last_pc();
}